

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

void __thiscall hmi::renderer::draw_circle(renderer *this,vec2f center,float radius,color4f color)

{
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 aVar1;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar2;
  double dVar3;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  float angle;
  int i;
  vertex vertices [50];
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_508;
  vec<float,_2UL> local_500;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_4f8;
  undefined8 local_4f0;
  float local_4e8 [2];
  float local_4e0;
  int local_4dc;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  int in_stack_fffffffffffffb3c;
  size_t in_stack_fffffffffffffb40;
  vertex *in_stack_fffffffffffffb48;
  renderer *in_stack_fffffffffffffb50;
  undefined1 auStack_28 [16];
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  aVar1 = (anon_union_8_5_712f1eca_for_vec<float,_2UL>_2)local_4d8;
  local_18 = in_XMM2_Qa;
  local_10 = in_XMM3_Qa;
  local_8 = in_XMM0_Qa;
  do {
    local_508 = aVar1;
    vertex::vertex((vertex *)local_508);
    aVar1.data = local_508.data + 0x18;
  } while (local_508.data + 0x18 != (float  [2])auStack_28);
  for (local_4dc = 0; local_4dc < 0x32; local_4dc = local_4dc + 1) {
    local_4e0 = ((float)local_4dc * 6.2831855) / 50.0;
    local_4f0 = local_8;
    dVar2 = std::sin((double)(ulong)(uint)local_4e0);
    dVar3 = std::cos((double)(ulong)(uint)local_4e0);
    vec<float,_2UL>::vec(&local_500,SUB84(dVar2,0),SUB84(dVar3,0));
    local_4f8.data = (float  [2])operator*(local_508.data[1],in_RDI.data);
    local_4e8 = (float  [2])operator+(in_RDI.data,local_508.data);
    *&(((anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *)(local_4d8 + (long)local_4dc * 0x18))->x).
      data = local_4e8;
    (&uStack_4d0)[(long)local_4dc * 3] = local_18;
    *(undefined8 *)(&stack0xfffffffffffffb38 + (long)local_4dc * 0x18) = local_10;
  }
  draw(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
       in_stack_fffffffffffffb3c);
  return;
}

Assistant:

void renderer::draw_circle(vec2f center, float radius, color4f color) {
    static constexpr int POINT_COUNT = 50;
    static constexpr float PI = 3.14159265359f;

    vertex vertices[POINT_COUNT];

    for (int i = 0; i < POINT_COUNT; ++i) {
      float angle = 2 * PI * i / POINT_COUNT;
      vertices[i].position = center + radius * vec2f(std::sin(angle), std::cos(angle));
      vertices[i].color = color;
    }

    draw(&vertices[0], POINT_COUNT, GL_LINE_LOOP);
  }